

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O3

void __thiscall
CoreML::TreeEnsembleClassifier::setOutputClassList
          (TreeEnsembleClassifier *this,vector<long,_std::allocator<long>_> *classes)

{
  RepeatedField<long> *this_00;
  uint uVar1;
  Model *pMVar2;
  ulong uVar3;
  long lVar4;
  TreeEnsembleClassifier *pTVar5;
  Int64Vector *pIVar6;
  long *plVar7;
  Arena *pAVar8;
  long tmp;
  ulong uVar9;
  
  pMVar2 = (this->super_TreeEnsembleBase).super_Model.m_spec.
           super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (pMVar2->_oneof_case_[0] == 0x192) {
    pTVar5 = (pMVar2->Type_).treeensembleclassifier_;
  }
  else {
    Specification::Model::clear_Type(pMVar2);
    pMVar2->_oneof_case_[0] = 0x192;
    uVar9 = (pMVar2->super_MessageLite)._internal_metadata_.ptr_;
    pAVar8 = (Arena *)(uVar9 & 0xfffffffffffffffc);
    if ((uVar9 & 1) != 0) {
      pAVar8 = *(Arena **)pAVar8;
    }
    pTVar5 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::TreeEnsembleClassifier>(pAVar8);
    (pMVar2->Type_).treeensembleclassifier_ = pTVar5;
  }
  if (pTVar5->_oneof_case_[0] == 0x65) {
    pIVar6 = (pTVar5->ClassLabels_).int64classlabels_;
  }
  else {
    Specification::TreeEnsembleClassifier::clear_ClassLabels(pTVar5);
    pTVar5->_oneof_case_[0] = 0x65;
    uVar9 = (pTVar5->super_MessageLite)._internal_metadata_.ptr_;
    pAVar8 = (Arena *)(uVar9 & 0xfffffffffffffffc);
    if ((uVar9 & 1) != 0) {
      pAVar8 = *(Arena **)pAVar8;
    }
    pIVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Vector>(pAVar8)
    ;
    (pTVar5->ClassLabels_).int64classlabels_ = pIVar6;
  }
  (pIVar6->vector_).current_size_ = 0;
  if ((classes->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (classes->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar9 = 0;
    do {
      pMVar2 = (this->super_TreeEnsembleBase).super_Model.m_spec.
               super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (pMVar2->_oneof_case_[0] == 0x192) {
        pTVar5 = (pMVar2->Type_).treeensembleclassifier_;
      }
      else {
        Specification::Model::clear_Type(pMVar2);
        pMVar2->_oneof_case_[0] = 0x192;
        uVar3 = (pMVar2->super_MessageLite)._internal_metadata_.ptr_;
        pAVar8 = (Arena *)(uVar3 & 0xfffffffffffffffc);
        if ((uVar3 & 1) != 0) {
          pAVar8 = *(Arena **)pAVar8;
        }
        pTVar5 = google::protobuf::Arena::
                 CreateMaybeMessage<CoreML::Specification::TreeEnsembleClassifier>(pAVar8);
        (pMVar2->Type_).treeensembleclassifier_ = pTVar5;
      }
      if (pTVar5->_oneof_case_[0] == 0x65) {
        pIVar6 = (pTVar5->ClassLabels_).int64classlabels_;
      }
      else {
        Specification::TreeEnsembleClassifier::clear_ClassLabels(pTVar5);
        pTVar5->_oneof_case_[0] = 0x65;
        uVar3 = (pTVar5->super_MessageLite)._internal_metadata_.ptr_;
        pAVar8 = (Arena *)(uVar3 & 0xfffffffffffffffc);
        if ((uVar3 & 1) != 0) {
          pAVar8 = *(Arena **)pAVar8;
        }
        pIVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Vector>
                           (pAVar8);
        (pTVar5->ClassLabels_).int64classlabels_ = pIVar6;
      }
      lVar4 = (classes->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar9];
      this_00 = &pIVar6->vector_;
      uVar1 = (pIVar6->vector_).current_size_;
      if (uVar1 == (pIVar6->vector_).total_size_) {
        google::protobuf::RepeatedField<long>::Reserve(this_00,uVar1 + 1);
        plVar7 = google::protobuf::RepeatedField<long>::elements(this_00);
        plVar7[uVar1] = lVar4;
      }
      else {
        plVar7 = google::protobuf::RepeatedField<long>::elements(this_00);
        plVar7[uVar1] = lVar4;
      }
      this_00->current_size_ = uVar1 + 1;
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)((long)(classes->super__Vector_base<long,_std::allocator<long>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(classes->super__Vector_base<long,_std::allocator<long>_>).
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void TreeEnsembleClassifier::setOutputClassList(const std::vector<int64_t>& classes) {
        m_spec->mutable_treeensembleclassifier()->mutable_int64classlabels()->clear_vector();
        for(size_t i = 0; i < classes.size(); ++i) {
            m_spec->mutable_treeensembleclassifier()->mutable_int64classlabels()->add_vector(classes[i]);
        }
    }